

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger_impl.h
# Opt level: O2

void __thiscall spdlog::async_logger::_sink_it(async_logger *this,log_msg *msg)

{
  double in_XMM0_Qa;
  
  details::async_log_helper::log
            ((this->_async_log_helper)._M_t.
             super___uniq_ptr_impl<spdlog::details::async_log_helper,_std::default_delete<spdlog::details::async_log_helper>_>
             ._M_t.
             super__Tuple_impl<0UL,_spdlog::details::async_log_helper_*,_std::default_delete<spdlog::details::async_log_helper>_>
             .super__Head_base<0UL,_spdlog::details::async_log_helper_*,_false>._M_head_impl,
             in_XMM0_Qa);
  if (msg->level != off &&
      (this->super_logger)._flush_level.super___atomic_base<int>._M_i <= (int)msg->level) {
    details::async_log_helper::flush
              ((this->_async_log_helper)._M_t.
               super___uniq_ptr_impl<spdlog::details::async_log_helper,_std::default_delete<spdlog::details::async_log_helper>_>
               ._M_t.
               super__Tuple_impl<0UL,_spdlog::details::async_log_helper_*,_std::default_delete<spdlog::details::async_log_helper>_>
               .super__Head_base<0UL,_spdlog::details::async_log_helper_*,_false>._M_head_impl,false
              );
  }
  return;
}

Assistant:

inline void spdlog::async_logger::_sink_it(details::log_msg &msg)
{
    try
    {
#if defined(SPDLOG_ENABLE_MESSAGE_COUNTER)
        _incr_msg_counter(msg);
#endif
        _async_log_helper->log(msg);
        if (_should_flush_on(msg))
        {
            _async_log_helper->flush(false); // do async flush
        }
    }
    catch (const std::exception &ex)
    {
        _err_handler(ex.what());
    }
    catch (...)
    {
        _err_handler("Unknown exception in logger " + _name);
        throw;
    }
}